

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DuplicateExtensionFieldNumber_Test::
TestBody(ValidationErrorTest_DuplicateExtensionFieldNumber_Test *this)

{
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string_view local_20;
  ValidationErrorTest_DuplicateExtensionFieldNumber_Test *local_10;
  ValidationErrorTest_DuplicateExtensionFieldNumber_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"option1\" number: 1000 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }"
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "name: \"bar.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"option2\" number: 1000 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }"
             ,&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "bar.proto: option2: NUMBER: Extension number 1000 has already been used in \"google.protobuf.FileOptions\" by extension \"option1\" defined in foo.proto.\n"
             ,&local_79);
  ValidationErrorTest::BuildFileWithWarnings(&this->super_ValidationErrorTest,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DuplicateExtensionFieldNumber) {
  BuildDescriptorMessagesInTestPool();

  BuildFile(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"option1\" number: 1000 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }");

  BuildFileWithWarnings(
      "name: \"bar.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"option2\" number: 1000 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FileOptions\" }",
      "bar.proto: option2: NUMBER: Extension number 1000 has already been used "
      "in \"google.protobuf.FileOptions\" by extension \"option1\" defined in "
      "foo.proto.\n");
}